

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

void helper_stmw_ppc64(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t reg)

{
  int mmu_idx;
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  uint *puVar4;
  ulong uVar5;
  uintptr_t unaff_retaddr;
  
  mmu_idx = env->dmmu_idx;
  puVar4 = (uint *)probe_contiguous(env,addr,reg * -4 + 0x80,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
  if (puVar4 == (uint *)0x0) {
    if (reg < 0x20) {
      uVar2 = (ulong)reg;
      do {
        uVar5 = uVar2 + 1;
        cpu_stl_mmuidx_ra_ppc64(env,addr,(uint32_t)env->gpr[uVar2],mmu_idx,unaff_retaddr);
        bVar3 = (int)env->msr < 0;
        if (env->mmu_model != POWERPC_MMU_BOOKE206) {
          bVar3 = (long)env->msr < 0;
        }
        addr = addr + 4;
        if (!bVar3) {
          addr = addr & 0xffffffff;
        }
        uVar2 = uVar5;
      } while ((int)uVar5 != 0x20);
    }
  }
  else if (reg < 0x20) {
    uVar2 = (ulong)reg;
    do {
      uVar5 = uVar2 + 1;
      uVar1 = (uint)env->gpr[uVar2];
      *puVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar4 = puVar4 + 1;
      uVar2 = uVar5;
    } while ((int)uVar5 != 0x20);
  }
  return;
}

Assistant:

void helper_stmw(CPUPPCState *env, target_ulong addr, uint32_t reg)
{
    uintptr_t raddr = GETPC();
    int mmu_idx = cpu_mmu_index(env, false);
    char *host = probe_contiguous(env, addr, (32 - reg) * 4,
                                  MMU_DATA_STORE, mmu_idx, raddr);

    if (likely(host)) {
        /* Fast path -- the entire operation is in RAM at host.  */
        for (; reg < 32; reg++) {
            stl_be_p(host, env->gpr[reg]);
            host += 4;
        }
    } else {
        /* Slow path -- at least some of the operation requires i/o.  */
        for (; reg < 32; reg++) {
            cpu_stl_mmuidx_ra(env, addr, env->gpr[reg], mmu_idx, raddr);
            addr = addr_add(env, addr, 4);
        }
    }
}